

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.hpp
# Opt level: O2

interval_t duckdb::ToSecondsOperator::Operation<double,duckdb::interval_t>(double input)

{
  interval_t iVar1;
  bool bVar2;
  OutOfRangeException *this;
  allocator local_71;
  double local_70;
  interval_t result;
  string local_58;
  string local_38;
  
  result.months = 0;
  result.days = 0;
  local_70 = input;
  bVar2 = TryMultiplyOperator::Operation<double,long,long>(input,1000000,&result.micros);
  if (bVar2) {
    iVar1.micros = result.micros;
    iVar1.months = result.months;
    iVar1.days = result.days;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Interval value %s seconds out of range",&local_71);
  std::__cxx11::to_string(&local_58,local_70);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>
            (this,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		interval_t result;
		result.months = 0;
		result.days = 0;
		if (!TryMultiplyOperator::Operation<TA, int64_t, int64_t>(input, Interval::MICROS_PER_SEC, result.micros)) {
			throw OutOfRangeException("Interval value %s seconds out of range", NumericHelper::ToString(input));
		}
		return result;
	}